

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

void __thiscall
t_cpp_generator::generate_enum_constant_list
          (t_cpp_generator *this,ostream *f,
          vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *constants,char *prefix,
          char *suffix,bool include_values)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  reference pptVar4;
  string *psVar5;
  __normal_iterator<t_enum_value_*const_*,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
  local_58;
  t_enum_value **local_50;
  byte local_41;
  const_iterator cStack_40;
  bool first;
  const_iterator c_iter;
  bool include_values_local;
  char *suffix_local;
  char *prefix_local;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *constants_local;
  ostream *f_local;
  t_cpp_generator *this_local;
  
  c_iter._M_current._7_1_ = include_values;
  poVar3 = std::operator<<(f," {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  __gnu_cxx::
  __normal_iterator<t_enum_value_*const_*,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
  ::__normal_iterator(&stack0xffffffffffffffc0);
  local_41 = 1;
  local_50 = (t_enum_value **)
             std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::begin(constants);
  cStack_40 = (const_iterator)local_50;
  while( true ) {
    local_58._M_current =
         (t_enum_value **)
         std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::end(constants);
    bVar1 = __gnu_cxx::operator!=(&stack0xffffffffffffffc0,&local_58);
    if (!bVar1) break;
    if ((local_41 & 1) == 0) {
      poVar3 = std::operator<<(f,",");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    }
    else {
      local_41 = 0;
    }
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_enum_value_*const_*,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
              ::operator*(&stack0xffffffffffffffc0);
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x22])(this,f,*pptVar4);
    poVar3 = t_generator::indent((t_generator *)this,f);
    poVar3 = std::operator<<(poVar3,prefix);
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_enum_value_*const_*,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
              ::operator*(&stack0xffffffffffffffc0);
    psVar5 = t_enum_value::get_name_abi_cxx11_(*pptVar4);
    poVar3 = std::operator<<(poVar3,(string *)psVar5);
    std::operator<<(poVar3,suffix);
    if ((c_iter._M_current._7_1_ & 1) != 0) {
      poVar3 = std::operator<<(f," = ");
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_enum_value_*const_*,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
                ::operator*(&stack0xffffffffffffffc0);
      iVar2 = t_enum_value::get_value(*pptVar4);
      std::ostream::operator<<(poVar3,iVar2);
    }
    __gnu_cxx::
    __normal_iterator<t_enum_value_*const_*,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
    ::operator++(&stack0xffffffffffffffc0);
  }
  std::operator<<(f,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  poVar3 = t_generator::indent((t_generator *)this,f);
  poVar3 = std::operator<<(poVar3,"};");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_cpp_generator::generate_enum_constant_list(std::ostream& f,
                                                  const vector<t_enum_value*>& constants,
                                                  const char* prefix,
                                                  const char* suffix,
                                                  bool include_values) {
  f << " {" << endl;
  indent_up();

  vector<t_enum_value*>::const_iterator c_iter;
  bool first = true;
  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    if (first) {
      first = false;
    } else {
      f << "," << endl;
    }
    generate_java_doc(f, *c_iter);
    indent(f) << prefix << (*c_iter)->get_name() << suffix;
    if (include_values) {
      f << " = " << (*c_iter)->get_value();
    }
  }

  f << endl;
  indent_down();
  indent(f) << "};" << endl;
}